

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  Layer *pLVar10;
  float fVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined4 uVar14;
  Mat *pMVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined8 uVar18;
  int iVar19;
  _func_int **pp_Var20;
  undefined1 uVar21;
  uint uVar22;
  _func_int **pp_Var23;
  _func_int *p_Var24;
  undefined4 *puVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  uint _elempack;
  uint uVar29;
  int iVar30;
  float fVar31;
  iterator iVar32;
  pointer pfVar33;
  int iVar34;
  Option *_elemsize;
  undefined1 (*pauVar35) [16];
  Option *opt_00;
  int iVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  __m128 min;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128 max;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  float *local_310;
  long local_2f8;
  float *local_2f0;
  undefined1 local_2e8 [40];
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  int iStack_2b0;
  undefined4 uStack_2ac;
  size_t local_2a8;
  ulong local_298;
  _func_int **local_290;
  Mat *local_288;
  long local_280;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  float local_1cc;
  pointer local_1c8;
  int *local_1c0;
  Allocator *local_1b8;
  int local_1b0;
  Allocator *local_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  undefined4 local_190;
  ulong local_188;
  _func_int **local_180;
  size_type local_178;
  long local_170;
  Mat local_168;
  void *local_120;
  int *local_118;
  ulong local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
  p_Var24 = pp_Var23[-3];
  iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var24);
  iVar36 = *(int *)(&this->field_0xd8 + (long)p_Var24);
  iVar30 = *(int *)(&this->field_0xdc + (long)p_Var24);
  iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var24);
  piVar7 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    uVar42 = (long)(local_168.elempack * local_168.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var23[-3]);
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_168.elempack * local_168.c,4,(Allocator *)0x0);
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
    p_Var24 = pp_Var23[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
      lVar27 = 0;
      puVar25 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar42) {
          uVar5 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar27 * 4);
          uVar41 = uVar42 & 0xffffffff;
          do {
            *puVar25 = uVar5;
            puVar25 = puVar25 + 1;
            uVar29 = (int)uVar41 - 1;
            uVar41 = (ulong)uVar29;
          } while (uVar29 != 0);
          p_Var24 = pp_Var23[-3];
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var24));
    }
    uVar12 = opt->lightmode;
    uVar13 = *(undefined3 *)&opt->field_0x1;
    uVar14 = opt->num_threads;
    local_2e8._4_4_ = uVar14;
    local_2e8._1_3_ = uVar13;
    local_2e8[0] = uVar12;
    local_2e8._16_8_ = opt->workspace_allocator;
    local_2e8._24_4_ = opt->openmp_blocktime;
    local_2e8[0x1c] = opt->use_winograd_convolution;
    local_2e8[0x1d] = opt->use_sgemm_convolution;
    local_2e8[0x1e] = opt->use_int8_inference;
    local_2e8[0x1f] = opt->use_vulkan_compute;
    local_2e8[0x20] = opt->use_bf16_storage;
    local_2e8[0x21] = opt->use_fp16_packed;
    local_2e8[0x22] = opt->use_fp16_storage;
    local_2e8[0x23] = opt->use_fp16_arithmetic;
    local_2e8[0x24] = opt->use_int8_packed;
    local_2e8[0x25] = opt->use_int8_storage;
    local_2e8[0x26] = opt->use_int8_arithmetic;
    local_2e8[0x27] = opt->use_packing_layout;
    unique0x00006d08 = opt->use_shader_pack8;
    unique0x00006d09 = opt->use_subgroup_basic;
    unique0x00006d0a = opt->use_subgroup_vote;
    unique0x00006d0b = opt->use_subgroup_ballot;
    unique0x00006d0c = opt->use_subgroup_shuffle;
    unique0x00006d0d = opt->use_image_storage;
    unique0x00006d0e = opt->use_tensor_storage;
    unique0x00006d0f = opt->use_reserved_0;
    uStack_2b8._0_4_ = opt->flush_denormals;
    unique0x00006d14 = opt->use_local_pool_allocator;
    unique0x00006d15 = opt->use_shader_local_memory;
    unique0x00006d16 = opt->use_cooperative_matrix;
    unique0x00006d17 = opt->use_winograd23_convolution;
    unique0x00006d18 = opt->use_winograd43_convolution;
    unique0x00006d19 = opt->use_winograd63_convolution;
    unique0x00006d1a = opt->use_a53_a55_optimized_kernel;
    unique0x00006d1b = opt->use_reserved_7;
    unique0x00006d1c = opt->use_reserved_8;
    unique0x00006d1d = opt->use_reserved_9;
    unique0x00006d1e = opt->use_reserved_10;
    unique0x00006d1f = opt->use_reserved_11;
    local_2e8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_228,(Option *)local_2e8);
    piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma + (long)pp_Var23[-3]),&local_168,
             &local_228,opt);
  iVar19 = local_228.w;
  iVar6 = local_228.elempack;
  iVar26 = -100;
  if ((local_228.data == (void *)0x0) || (lVar27 = (long)local_228.c, local_228.cstep * lVar27 == 0)
     ) goto LAB_003e3d8d;
  p_Var24 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar28 = (~((iVar28 + -1) * iVar30) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var24);
  iVar30 = iVar28 + 1;
  uVar42 = (long)(~((iVar36 + -1) * iVar4) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var24);
  local_230 = uVar42 & 0xffffffff;
  iVar36 = (int)uVar42 + 1;
  uVar29 = local_228.elempack * local_228.c;
  if ((uVar29 == *(uint *)(&this->field_0x108 + (long)p_Var24)) &&
     (uVar29 == *(uint *)(&this->field_0xd0 + (long)p_Var24))) {
    uVar22 = 8;
    if (opt->use_packing_layout == false) {
      uVar22 = 1;
    }
    if ((uVar29 & 7) != 0) {
      uVar22 = 1;
    }
    opt_00 = (Option *)(ulong)uVar22;
    iVar4 = *(int *)(&this->field_0x10c + (long)p_Var24);
    _elemsize = (Option *)(ulong)(uVar22 * 4);
    if (100 < iVar4) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar30,iVar36,(int)uVar29 / (int)uVar22,(size_t)_elemsize,uVar22,
                opt->blob_allocator);
    iVar26 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003e3d8d;
    iVar26 = 0;
    if (iVar6 == 1) {
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var24 = pp_Var23[-3];
      iVar36 = *(int *)(&this->field_0xd8 + (long)p_Var24);
      if (iVar36 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var24) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var24) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var24) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var24) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var24) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var24) < 2)))) {
          if (iVar4 < 0x65) {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var23[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar27 = 0;
              do {
                fVar31 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) +
                                          lVar27 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar27 * 4
                                         ));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar31);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar31;
                  local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var23[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar27 = 0;
              do {
                fVar31 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar27 * 4);
                fVar44 = 0.0;
                if (fVar31 != 0.0) {
                  fVar44 = 1.0 / (fVar31 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24)
                                                     + lVar27 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar44);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var24) +
                                               lVar27 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                  iVar32._M_current = (float *)local_2e8._8_8_;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar44;
                  iVar32._M_current = (float *)(local_2e8._8_8_ + 4);
                  local_2e8._8_8_ = iVar32._M_current;
                }
                if (iVar32._M_current == (float *)local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,iVar32,
                             (float *)&local_1c8);
                }
                else {
                  *iVar32._M_current = local_1c8._0_4_;
                  local_2e8._8_8_ = iVar32._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar36 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var24) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var24) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var24) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var24) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var24))) goto LAB_003e37dd;
          if (iVar4 < 0x65) {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var23[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar27 = 0;
              do {
                fVar31 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) +
                                          lVar27 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar27 * 4
                                         ));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar31);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar31;
                  local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_d8,opt_00);
          }
          else {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var23[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar27 = 0;
              do {
                fVar31 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar27 * 4);
                fVar44 = 0.0;
                if (fVar31 != 0.0) {
                  fVar44 = 1.0 / (fVar31 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24)
                                                     + lVar27 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar44);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var24) +
                                               lVar27 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                  iVar32._M_current = (float *)local_2e8._8_8_;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar44;
                  iVar32._M_current = (float *)(local_2e8._8_8_ + 4);
                  local_2e8._8_8_ = iVar32._M_current;
                }
                if (iVar32._M_current == (float *)local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,iVar32,
                             (float *)&local_1c8);
                }
                else {
                  *iVar32._M_current = local_1c8._0_4_;
                  local_2e8._8_8_ = iVar32._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
        }
        pLVar10 = this->activation;
        if (pLVar10 != (Layer *)0x0) {
          (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          iVar26 = 0;
          goto LAB_003e3d8d;
        }
      }
      else {
LAB_003e37dd:
        uVar29 = iVar36 * *(int *)(&this->field_0xd4 + (long)p_Var24);
        local_178 = (size_type)(int)uVar29;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2e8,local_178,
                   (allocator_type *)&local_278);
        uVar16 = local_2e8._0_8_;
        pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var24 = pp_Var23[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var24)) {
          iVar36 = *(int *)(&this->field_0xe0 + (long)p_Var24);
          iVar30 = *(int *)(&this->field_0xdc + (long)p_Var24);
          iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var24);
          iVar26 = 0;
          fVar31 = 0.0;
          iVar34 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var24)) {
              lVar27 = 0;
              do {
                *(float *)(local_2e8._0_8_ + (iVar34 + lVar27) * 4) = fVar31;
                p_Var24 = pp_Var23[-3];
                fVar31 = (float)((int)fVar31 + *(int *)(&this->field_0xdc + (long)p_Var24));
                lVar27 = lVar27 + 1;
              } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var24));
              iVar34 = iVar34 + (int)lVar27;
            }
            fVar31 = (float)((int)fVar31 + (iVar19 * iVar36 - iVar30 * iVar6));
            iVar26 = iVar26 + 1;
          } while (iVar26 < *(int *)(&this->field_0xd8 + (long)p_Var24));
        }
        pfVar33 = (pointer)local_2e8._0_8_;
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
          lVar27 = 0;
          auVar88 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          lVar40 = 0;
          local_288 = top_blob;
          local_180 = pp_Var23;
          do {
            pvVar8 = local_228.data;
            if (-1 < (int)local_230) {
              lVar37 = local_228.cstep * lVar40 * local_228.elemsize;
              local_310 = (float *)(local_288->elemsize * lVar40 * local_288->cstep +
                                   (long)local_288->data);
              local_290 = this->_vptr_ConvolutionDepthWise_x86_fma;
              lVar39 = (long)local_228.w * local_228.elemsize;
              pvVar9 = (this->weight_data_tm).data;
              local_1d8 = 0;
              local_2f0 = local_310;
              local_280 = lVar39;
              local_170 = lVar27;
              do {
                if (-1 < iVar28) {
                  local_298 = (ulong)(int)local_1d8;
                  iVar36 = 0;
                  do {
                    p_Var24 = local_290[-3];
                    fVar31 = 0.0;
                    fVar44 = 0.0;
                    if (0 < (int)uVar29) {
                      uVar42 = 0;
                      iVar30 = 0;
                      do {
                        iVar30 = iVar30 + (int)*(char *)((long)pvVar9 + uVar42 + lVar27) *
                                          (int)*(char *)((long)pvVar8 +
                                                        (long)(int)*(pointer)(uVar16 + uVar42 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var24) * local_298 *
                                                        lVar39 + (long)iVar36 *
                                                                 (long)*(int *)(&this->field_0xe4 +
                                                                               (long)p_Var24) +
                                                                 lVar37);
                        uVar42 = uVar42 + 1;
                      } while (uVar29 != uVar42);
                      fVar44 = (float)iVar30;
                    }
                    fVar2 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar40 * 4);
                    if (fVar2 != 0.0) {
                      fVar31 = 1.0 / (fVar2 * *(float *)(*(long *)(&this->field_0x240 +
                                                                  (long)p_Var24) + lVar40 * 4));
                    }
                    fVar31 = fVar31 * fVar44;
                    if (*(int *)(&this->field_0x100 + (long)p_Var24) != 0) {
                      fVar31 = fVar31 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                                  lVar40 * 4);
                    }
                    auVar104 = ZEXT416((uint)fVar31);
                    fVar44 = fVar31;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var24)) {
                    case 1:
                      auVar104 = vmaxss_avx(auVar104,ZEXT416(0));
                      fVar44 = auVar104._0_4_;
                      break;
                    case 2:
                      auVar104 = vcmpss_avx(ZEXT816(0) << 0x40,auVar104,1);
                      auVar79._8_4_ = 0x3f800000;
                      auVar79._0_8_ = 0x3f8000003f800000;
                      auVar79._12_4_ = 0x3f800000;
                      auVar104 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var24)),auVar79,auVar104);
                      fVar44 = auVar104._0_4_ * fVar31;
                      break;
                    case 3:
                      fVar31 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var24))[1];
                      auVar104 = vmaxss_avx(auVar104,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                        (long)p_Var24)));
                      fVar44 = auVar104._0_4_;
                      if (fVar31 < auVar104._0_4_) {
                        fVar44 = fVar31;
                      }
                      break;
                    case 4:
                      auVar104 = vminss_avx(auVar104,ZEXT416(0x42b0c0a5));
                      auVar149._0_4_ = auVar104._0_4_ ^ auVar88._0_4_;
                      auVar149._4_4_ = auVar104._4_4_ ^ auVar88._4_4_;
                      auVar149._8_4_ = auVar104._8_4_ ^ auVar88._8_4_;
                      auVar149._12_4_ = auVar104._12_4_ ^ auVar88._12_4_;
                      auVar104 = vcmpss_avx(auVar104,ZEXT416(0xc2b0c0a5),1);
                      auVar144._8_4_ = 0x42b0c0a5;
                      auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar144._12_4_ = 0x42b0c0a5;
                      auVar104 = vblendvps_avx(auVar149,auVar144,auVar104);
                      fVar31 = expf(auVar104._0_4_);
                      auVar88 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      lVar39 = local_280;
                      fVar44 = 1.0 / (fVar31 + 1.0);
                      break;
                    case 5:
                      local_1cc = fVar31;
                      fVar31 = expf(fVar31);
                      fVar31 = logf(fVar31 + 1.0);
                      fVar31 = tanhf(fVar31);
                      auVar88 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      lVar39 = local_280;
                      fVar44 = fVar31 * local_1cc;
                      break;
                    case 6:
                      fVar2 = **(float **)(&this->field_0x118 + (long)p_Var24);
                      fVar3 = (*(float **)(&this->field_0x118 + (long)p_Var24))[1];
                      fVar81 = (float)((uint)fVar3 ^ auVar88._0_4_) / fVar2;
                      fVar44 = 0.0;
                      if ((fVar81 <= fVar31) && (fVar44 = fVar31, fVar31 <= fVar81 + 1.0 / fVar2)) {
                        auVar104 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar104,
                                                   ZEXT416((uint)fVar3));
                        fVar44 = auVar104._0_4_ * fVar31;
                      }
                    }
                    if (iVar4 < 0x65) {
                      *local_310 = fVar44;
                      local_310 = local_310 + 1;
                    }
                    else {
                      fVar44 = fVar44 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var24) +
                                                  lVar40 * 4);
                      auVar104 = vandps_avx(ZEXT416((uint)fVar44),auVar88._0_16_);
                      auVar80._8_4_ = 0x3effffff;
                      auVar80._0_8_ = 0x3effffff3effffff;
                      auVar80._12_4_ = 0x3effffff;
                      auVar104 = vorps_avx(auVar104,auVar80);
                      auVar104 = ZEXT416((uint)(fVar44 + auVar104._0_4_));
                      auVar104 = vroundss_avx(auVar104,auVar104,0xb);
                      iVar30 = (int)auVar104._0_4_;
                      if (iVar30 < -0x7e) {
                        iVar30 = -0x7f;
                      }
                      uVar21 = (undefined1)iVar30;
                      if (0x7e < iVar30) {
                        uVar21 = 0x7f;
                      }
                      *(undefined1 *)local_2f0 = uVar21;
                      local_2f0 = (float *)((long)local_2f0 + 1);
                    }
                    bVar43 = iVar36 != iVar28;
                    iVar36 = iVar36 + 1;
                  } while (bVar43);
                }
                iVar36 = (int)local_1d8;
                local_1d8 = (ulong)(iVar36 + 1);
              } while (iVar36 != (int)local_230);
              p_Var24 = local_180[-3];
              lVar27 = local_170;
            }
            lVar40 = lVar40 + 1;
            lVar27 = lVar27 + local_178;
          } while (lVar40 < *(int *)(&this->field_0x108 + (long)p_Var24));
          pfVar33 = (pointer)local_2e8._0_8_;
        }
        if (pfVar33 != (pointer)0x0) {
          uVar42 = local_2e8._16_8_ - (long)pfVar33;
          goto LAB_003e3ca0;
        }
      }
    }
    else {
      if (iVar6 != 8) goto LAB_003e3d8d;
      uVar42 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             );
      local_280 = lVar27;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2e8,uVar42,(allocator_type *)&local_278)
      ;
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var24 = pp_Var23[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var24)) {
        iVar36 = *(int *)(&this->field_0xe0 + (long)p_Var24);
        iVar30 = *(int *)(&this->field_0xdc + (long)p_Var24);
        iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var24);
        iVar26 = 0;
        fVar31 = 0.0;
        iVar34 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var24)) {
            lVar27 = 0;
            do {
              *(float *)(local_2e8._0_8_ + (iVar26 + lVar27) * 4) = fVar31;
              p_Var24 = pp_Var23[-3];
              fVar31 = (float)((int)fVar31 + *(int *)(&this->field_0xdc + (long)p_Var24));
              lVar27 = lVar27 + 1;
            } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var24));
            iVar26 = iVar26 + (int)lVar27;
          }
          fVar31 = (float)((int)fVar31 + (iVar19 * iVar36 - iVar30 * iVar6));
          iVar34 = iVar34 + 1;
        } while (iVar34 < *(int *)(&this->field_0xd8 + (long)p_Var24));
      }
      if (0 < (int)local_280) {
        local_298 = 0;
        local_2f8 = 0;
        do {
          if (-1 < (int)local_230) {
            pauVar35 = (undefined1 (*) [16])
                       (top_blob->elemsize * local_2f8 * top_blob->cstep + (long)top_blob->data);
            pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
            pvVar8 = (this->weight_data_tm).data;
            pp_Var20 = (_func_int **)0x0;
            pauVar38 = pauVar35;
            do {
              local_290 = pp_Var20;
              iVar36 = (int)local_290;
              if (-1 < iVar28) {
                iVar30 = 0;
                do {
                  p_Var24 = pp_Var23[-3];
                  if ((int)uVar42 < 1) {
                    auVar149 = ZEXT816(0) << 0x40;
                    auVar104 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar88 = ZEXT1664((undefined1  [16])0x0);
                    uVar41 = 0;
                    auVar94 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ =
                           *(ulong *)((long)local_228.data +
                                     (long)(int)*(pointer)(local_2e8._0_8_ + uVar41 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var24) *
                                     (long)iVar36 * (long)local_228.w * local_228.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var24) * iVar30 * 8
                                           ) + local_228.cstep * local_2f8 * local_228.elemsize);
                      auVar104 = vpcmpgtb_avx((undefined1  [16])0x0,auVar95);
                      auVar149 = vpunpcklbw_avx(auVar95,auVar104);
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = *(ulong *)((long)pvVar8 + uVar41 * 8 + (long)(int)local_298);
                      auVar104 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                      auVar104 = vpunpcklbw_avx(auVar102,auVar104);
                      auVar144 = vpmullw_avx(auVar104,auVar149);
                      auVar149 = vpmulhw_avx(auVar149,auVar104);
                      auVar104 = vpunpcklwd_avx(auVar144,auVar149);
                      auVar104 = vpaddd_avx(auVar88._0_16_,auVar104);
                      auVar88 = ZEXT1664(auVar104);
                      auVar149 = vpunpckhwd_avx(auVar144,auVar149);
                      auVar149 = vpaddd_avx(auVar94._0_16_,auVar149);
                      auVar94 = ZEXT1664(auVar149);
                      uVar41 = uVar41 + 1;
                    } while ((uVar42 & 0xffffffff) != uVar41);
                    auVar104 = vcvtdq2ps_avx(auVar104);
                    auVar149 = vcvtdq2ps_avx(auVar149);
                  }
                  auVar144 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var24) + local_2f8 * 0x20);
                  auVar79 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1f8 + (long)p_Var24) + 0x10 +
                             local_2f8 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var24) +
                                    local_2f8 * 0x20);
                  auVar141._0_4_ = auVar144._0_4_ * *pfVar1;
                  auVar141._4_4_ = auVar144._4_4_ * pfVar1[1];
                  auVar141._8_4_ = auVar144._8_4_ * pfVar1[2];
                  auVar141._12_4_ = auVar144._12_4_ * pfVar1[3];
                  auVar80 = vrcpps_avx(auVar141);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + 0x10 +
                                    local_2f8 * 0x20);
                  auVar168._0_4_ = auVar79._0_4_ * *pfVar1;
                  auVar168._4_4_ = auVar79._4_4_ * pfVar1[1];
                  auVar168._8_4_ = auVar79._8_4_ * pfVar1[2];
                  auVar168._12_4_ = auVar79._12_4_ * pfVar1[3];
                  auVar95 = vrcpps_avx(auVar168);
                  auVar144 = vcmpps_avx(auVar144,(undefined1  [16])0x0,4);
                  auVar144 = vandps_avx(auVar80,auVar144);
                  auVar89._0_4_ = auVar144._0_4_ * auVar104._0_4_;
                  auVar89._4_4_ = auVar144._4_4_ * auVar104._4_4_;
                  auVar89._8_4_ = auVar144._8_4_ * auVar104._8_4_;
                  auVar89._12_4_ = auVar144._12_4_ * auVar104._12_4_;
                  auVar104 = vcmpps_avx(auVar79,(undefined1  [16])0x0,4);
                  auVar104 = vandps_avx(auVar95,auVar104);
                  auVar82._0_4_ = auVar104._0_4_ * auVar149._0_4_;
                  auVar82._4_4_ = auVar104._4_4_ * auVar149._4_4_;
                  auVar82._8_4_ = auVar104._8_4_ * auVar149._8_4_;
                  auVar82._12_4_ = auVar104._12_4_ * auVar149._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var24) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                      local_2f8 * 0x20);
                    auVar89._0_4_ = auVar89._0_4_ + *pfVar1;
                    auVar89._4_4_ = auVar89._4_4_ + pfVar1[1];
                    auVar89._8_4_ = auVar89._8_4_ + pfVar1[2];
                    auVar89._12_4_ = auVar89._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var24) + 0x10 +
                                      local_2f8 * 0x20);
                    auVar82._0_4_ = auVar82._0_4_ + *pfVar1;
                    auVar82._4_4_ = auVar82._4_4_ + pfVar1[1];
                    auVar82._8_4_ = auVar82._8_4_ + pfVar1[2];
                    auVar82._12_4_ = auVar82._12_4_ + pfVar1[3];
                  }
                  fVar31 = auVar89._4_4_;
                  fVar3 = auVar89._8_4_;
                  fVar44 = auVar82._4_4_;
                  fVar2 = auVar82._8_4_;
                  fVar11 = auVar89._12_4_;
                  fVar81 = auVar82._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var24)) {
                  case 1:
                    auVar89 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                    auVar82 = vmaxps_avx(auVar82,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar104 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                    auVar149 = vminps_avx(auVar89,(undefined1  [16])0x0);
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var24);
                    auVar110._4_4_ = uVar5;
                    auVar110._0_4_ = uVar5;
                    auVar110._8_4_ = uVar5;
                    auVar110._12_4_ = uVar5;
                    auVar89 = vfmadd213ps_fma(auVar149,auVar110,auVar104);
                    auVar104 = vmaxps_avx(auVar82,(undefined1  [16])0x0);
                    auVar149 = vminps_avx(auVar82,(undefined1  [16])0x0);
                    auVar82 = vfmadd213ps_fma(auVar149,auVar110,auVar104);
                    break;
                  case 3:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var24);
                    auVar98._4_4_ = uVar5;
                    auVar98._0_4_ = uVar5;
                    auVar98._8_4_ = uVar5;
                    auVar98._12_4_ = uVar5;
                    uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var24))[1];
                    auVar109._4_4_ = uVar5;
                    auVar109._0_4_ = uVar5;
                    auVar109._8_4_ = uVar5;
                    auVar109._12_4_ = uVar5;
                    auVar104 = vmaxps_avx(auVar89,auVar98);
                    auVar89 = vminps_avx(auVar104,auVar109);
                    auVar104 = vmaxps_avx(auVar82,auVar98);
                    auVar82 = vminps_avx(auVar104,auVar109);
                    break;
                  case 4:
                    auVar90._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                    auVar90._8_4_ = -fVar3;
                    auVar90._12_4_ = -fVar11;
                    auVar136._8_4_ = 0x42b0c0a5;
                    auVar136._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar136._12_4_ = 0x42b0c0a5;
                    auVar104 = vminps_avx(auVar136,auVar90);
                    auVar140._8_4_ = 0xc2b0c0a5;
                    auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar140._12_4_ = 0xc2b0c0a5;
                    auVar144 = vmaxps_avx(auVar140,auVar104);
                    auVar131._8_4_ = 0x3fb8aa3b;
                    auVar131._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar131._12_4_ = 0x3fb8aa3b;
                    auVar48._8_4_ = 0x3f000000;
                    auVar48._0_8_ = 0x3f0000003f000000;
                    auVar48._12_4_ = 0x3f000000;
                    auVar104 = vfmadd213ps_fma(auVar131,auVar144,auVar48);
                    auVar99._0_4_ = (int)auVar104._0_4_;
                    auVar99._4_4_ = (int)auVar104._4_4_;
                    auVar99._8_4_ = (int)auVar104._8_4_;
                    auVar99._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar99);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar78._8_4_ = 0x3f800000;
                    auVar78._0_8_ = 0x3f8000003f800000;
                    auVar78._12_4_ = 0x3f800000;
                    auVar104 = vandps_avx(auVar104,auVar78);
                    auVar79 = vsubps_avx(auVar149,auVar104);
                    auVar127._8_4_ = 0x3f318000;
                    auVar127._0_8_ = 0x3f3180003f318000;
                    auVar127._12_4_ = 0x3f318000;
                    auVar104 = vfmsub231ps_fma(auVar144,auVar79,auVar127);
                    auVar174._8_4_ = 0xb95e8083;
                    auVar174._0_8_ = 0xb95e8083b95e8083;
                    auVar174._12_4_ = 0xb95e8083;
                    auVar149 = vfnmsub231ps_fma(auVar104,auVar79,auVar174);
                    auVar153._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                    auVar153._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                    auVar153._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                    auVar153._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                    auVar167._8_4_ = 0x39506967;
                    auVar167._0_8_ = 0x3950696739506967;
                    auVar167._12_4_ = 0x39506967;
                    auVar178._8_4_ = 0x3ab743ce;
                    auVar178._0_8_ = 0x3ab743ce3ab743ce;
                    auVar178._12_4_ = 0x3ab743ce;
                    auVar104 = vfmadd213ps_fma(auVar167,auVar149,auVar178);
                    auVar180._8_4_ = 0x3c088908;
                    auVar180._0_8_ = 0x3c0889083c088908;
                    auVar180._12_4_ = 0x3c088908;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar149,auVar180);
                    auVar128._8_4_ = 0x3d2aa9c1;
                    auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar128._12_4_ = 0x3d2aa9c1;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar149,auVar128);
                    auVar129._8_4_ = 0x3e2aaaaa;
                    auVar129._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar129._12_4_ = 0x3e2aaaaa;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar149,auVar129);
                    auVar104 = vfmadd213ps_fma(auVar104,auVar149,auVar48);
                    auVar80 = vfmadd213ps_fma(auVar104,auVar153,auVar149);
                    auVar83._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                    auVar83._8_4_ = -fVar2;
                    auVar83._12_4_ = -fVar81;
                    auVar104 = vminps_avx(auVar136,auVar83);
                    auVar144 = vmaxps_avx(auVar140,auVar104);
                    auVar104 = vfmadd213ps_fma(auVar131,auVar144,auVar48);
                    auVar154._0_4_ = (int)auVar104._0_4_;
                    auVar154._4_4_ = (int)auVar104._4_4_;
                    auVar154._8_4_ = (int)auVar104._8_4_;
                    auVar154._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar154);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar104 = vandps_avx(auVar104,auVar78);
                    auVar149 = vsubps_avx(auVar149,auVar104);
                    auVar132._8_4_ = 0x3f318000;
                    auVar132._0_8_ = 0x3f3180003f318000;
                    auVar132._12_4_ = 0x3f318000;
                    auVar104 = vfmsub231ps_fma(auVar144,auVar149,auVar132);
                    auVar144 = vfnmsub231ps_fma(auVar104,auVar149,auVar174);
                    auVar155._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                    auVar155._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                    auVar155._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                    auVar155._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                    auVar104 = vfmadd213ps_fma(auVar167,auVar144,auVar178);
                    auVar104 = vfmadd213ps_fma(auVar104,auVar144,auVar180);
                    auVar133._8_4_ = 0x3d2aa9c1;
                    auVar133._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar133._12_4_ = 0x3d2aa9c1;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar144,auVar133);
                    auVar104 = vfmadd213ps_fma(auVar104,auVar144,auVar129);
                    auVar104 = vfmadd213ps_fma(auVar104,auVar144,auVar48);
                    auVar144 = vfmadd213ps_fma(auVar104,auVar155,auVar144);
                    auVar84._0_4_ = auVar80._0_4_ + 1.0;
                    auVar84._4_4_ = auVar80._4_4_ + 1.0;
                    auVar84._8_4_ = auVar80._8_4_ + 1.0;
                    auVar84._12_4_ = auVar80._12_4_ + 1.0;
                    auVar91._0_4_ = (int)auVar79._0_4_;
                    auVar91._4_4_ = (int)auVar79._4_4_;
                    auVar91._8_4_ = (int)auVar79._8_4_;
                    auVar91._12_4_ = (int)auVar79._12_4_;
                    auVar104 = vpslld_avx(auVar91,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar78);
                    auVar79 = vfmadd213ps_fma(auVar104,auVar84,auVar78);
                    auVar104 = vrcpps_avx(auVar79);
                    auVar79 = vfmsub213ps_fma(auVar79,auVar104,auVar78);
                    auVar89 = vfnmadd132ps_fma(auVar79,auVar104,auVar104);
                    auVar100._0_4_ = auVar144._0_4_ + 1.0;
                    auVar100._4_4_ = auVar144._4_4_ + 1.0;
                    auVar100._8_4_ = auVar144._8_4_ + 1.0;
                    auVar100._12_4_ = auVar144._12_4_ + 1.0;
                    auVar85._0_4_ = (int)auVar149._0_4_;
                    auVar85._4_4_ = (int)auVar149._4_4_;
                    auVar85._8_4_ = (int)auVar149._8_4_;
                    auVar85._12_4_ = (int)auVar149._12_4_;
                    auVar104 = vpslld_avx(auVar85,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar78);
                    auVar149 = vfmadd213ps_fma(auVar104,auVar100,auVar78);
                    auVar104 = vrcpps_avx(auVar149);
                    auVar149 = vfmsub213ps_fma(auVar149,auVar104,auVar78);
                    auVar82 = vfnmadd132ps_fma(auVar149,auVar104,auVar104);
                    break;
                  case 5:
                    auVar104._8_4_ = 0x42b0c0a5;
                    auVar104._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar104._12_4_ = 0x42b0c0a5;
                    auVar104 = vminps_avx(auVar89,auVar104);
                    auVar45._8_4_ = 0xc2b0c0a5;
                    auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar45._12_4_ = 0xc2b0c0a5;
                    auVar144 = vmaxps_avx(auVar104,auVar45);
                    auVar179._8_4_ = 0x3fb8aa3b;
                    auVar179._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar179._12_4_ = 0x3fb8aa3b;
                    auVar130._8_4_ = 0x3f000000;
                    auVar130._0_8_ = 0x3f0000003f000000;
                    auVar130._12_4_ = 0x3f000000;
                    auVar104 = vfmadd213ps_fma(auVar179,auVar144,auVar130);
                    auVar142._0_4_ = (int)auVar104._0_4_;
                    auVar142._4_4_ = (int)auVar104._4_4_;
                    auVar142._8_4_ = (int)auVar104._8_4_;
                    auVar142._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar142);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar46._8_4_ = 0x3f800000;
                    auVar46._0_8_ = 0x3f8000003f800000;
                    auVar46._12_4_ = 0x3f800000;
                    auVar104 = vandps_avx(auVar104,auVar46);
                    auVar104 = vsubps_avx(auVar149,auVar104);
                    auVar112._8_4_ = 0x3f318000;
                    auVar112._0_8_ = 0x3f3180003f318000;
                    auVar112._12_4_ = 0x3f318000;
                    auVar149 = vfmsub231ps_fma(auVar144,auVar104,auVar112);
                    auVar113._8_4_ = 0xb95e8083;
                    auVar113._0_8_ = 0xb95e8083b95e8083;
                    auVar113._12_4_ = 0xb95e8083;
                    auVar144 = vfnmsub231ps_fma(auVar149,auVar104,auVar113);
                    auVar143._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                    auVar143._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                    auVar143._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                    auVar143._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                    auVar169._8_4_ = 0x39506967;
                    auVar169._0_8_ = 0x3950696739506967;
                    auVar169._12_4_ = 0x39506967;
                    auVar114._8_4_ = 0x3ab743ce;
                    auVar114._0_8_ = 0x3ab743ce3ab743ce;
                    auVar114._12_4_ = 0x3ab743ce;
                    auVar149 = vfmadd213ps_fma(auVar169,auVar144,auVar114);
                    auVar156._8_4_ = 0x3c088908;
                    auVar156._0_8_ = 0x3c0889083c088908;
                    auVar156._12_4_ = 0x3c088908;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar156);
                    auVar137._8_4_ = 0x3d2aa9c1;
                    auVar137._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar137._12_4_ = 0x3d2aa9c1;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar137);
                    auVar115._8_4_ = 0x3e2aaaaa;
                    auVar115._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar115._12_4_ = 0x3e2aaaaa;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar115);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar130);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar143,auVar144);
                    auVar96._0_4_ = auVar149._0_4_ + 1.0;
                    auVar96._4_4_ = auVar149._4_4_ + 1.0;
                    auVar96._8_4_ = auVar149._8_4_ + 1.0;
                    auVar96._12_4_ = auVar149._12_4_ + 1.0;
                    auVar103._0_4_ = (int)auVar104._0_4_;
                    auVar103._4_4_ = (int)auVar104._4_4_;
                    auVar103._8_4_ = (int)auVar104._8_4_;
                    auVar103._12_4_ = (int)auVar104._12_4_;
                    auVar104 = vpslld_avx(auVar103,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar46);
                    auVar104 = vfmadd213ps_fma(auVar104,auVar96,auVar46);
                    auVar149 = vcmpps_avx(auVar104,(undefined1  [16])0x0,2);
                    auVar116._8_4_ = 0x800000;
                    auVar116._0_8_ = 0x80000000800000;
                    auVar116._12_4_ = 0x800000;
                    auVar104 = vmaxps_avx(auVar104,auVar116);
                    auVar144 = vpsrld_avx(auVar104,0x17);
                    auVar117._8_4_ = 0x807fffff;
                    auVar117._0_8_ = 0x807fffff807fffff;
                    auVar117._12_4_ = 0x807fffff;
                    auVar104 = vandps_avx(auVar104,auVar117);
                    auVar80 = vorps_avx(auVar130,auVar104);
                    auVar118._8_4_ = 0xffffff82;
                    auVar118._0_8_ = 0xffffff82ffffff82;
                    auVar118._12_4_ = 0xffffff82;
                    auVar104 = vpaddd_avx(auVar144,auVar118);
                    auVar79 = vcvtdq2ps_avx(auVar104);
                    auVar119._8_4_ = 0x3f3504f3;
                    auVar119._0_8_ = 0x3f3504f33f3504f3;
                    auVar119._12_4_ = 0x3f3504f3;
                    auVar144 = vcmpps_avx(auVar80,auVar119,1);
                    auVar104 = vandps_avx(auVar144,auVar80);
                    auVar105._0_4_ = auVar80._0_4_ + -1.0 + auVar104._0_4_;
                    auVar105._4_4_ = auVar80._4_4_ + -1.0 + auVar104._4_4_;
                    auVar105._8_4_ = auVar80._8_4_ + -1.0 + auVar104._8_4_;
                    auVar105._12_4_ = auVar80._12_4_ + -1.0 + auVar104._12_4_;
                    auVar104 = vandps_avx(auVar144,auVar46);
                    auVar104 = vsubps_avx(auVar79,auVar104);
                    auVar145._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar145._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar145._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar145._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar170._8_4_ = 0x3d9021bb;
                    auVar170._0_8_ = 0x3d9021bb3d9021bb;
                    auVar170._12_4_ = 0x3d9021bb;
                    auVar157._8_4_ = 0xbdebd1b8;
                    auVar157._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar157._12_4_ = 0xbdebd1b8;
                    auVar144 = vfmadd213ps_fma(auVar170,auVar105,auVar157);
                    auVar158._8_4_ = 0x3def251a;
                    auVar158._0_8_ = 0x3def251a3def251a;
                    auVar158._12_4_ = 0x3def251a;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar158);
                    auVar159._8_4_ = 0xbdfe5d4f;
                    auVar159._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar159._12_4_ = 0xbdfe5d4f;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar159);
                    auVar160._8_4_ = 0x3e11e9bf;
                    auVar160._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar160._12_4_ = 0x3e11e9bf;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar160);
                    auVar161._8_4_ = 0xbe2aae50;
                    auVar161._0_8_ = 0xbe2aae50be2aae50;
                    auVar161._12_4_ = 0xbe2aae50;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar161);
                    auVar162._8_4_ = 0x3e4cceac;
                    auVar162._0_8_ = 0x3e4cceac3e4cceac;
                    auVar162._12_4_ = 0x3e4cceac;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar162);
                    auVar163._8_4_ = 0xbe7ffffc;
                    auVar163._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar163._12_4_ = 0xbe7ffffc;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar163);
                    auVar164._8_4_ = 0x3eaaaaaa;
                    auVar164._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar164._12_4_ = 0x3eaaaaaa;
                    auVar144 = vfmadd213ps_fma(auVar144,auVar105,auVar164);
                    auVar171._0_4_ = auVar145._0_4_ * auVar105._0_4_ * auVar144._0_4_;
                    auVar171._4_4_ = auVar145._4_4_ * auVar105._4_4_ * auVar144._4_4_;
                    auVar171._8_4_ = auVar145._8_4_ * auVar105._8_4_ * auVar144._8_4_;
                    auVar171._12_4_ = auVar145._12_4_ * auVar105._12_4_ * auVar144._12_4_;
                    auVar144 = vfmadd231ps_fma(auVar171,auVar104,auVar113);
                    auVar144 = vfmsub231ps_fma(auVar144,auVar130,auVar145);
                    auVar144 = vsubps_avx(auVar144,auVar105);
                    auVar104 = vfmsub231ps_fma(auVar144,auVar112,auVar104);
                    auVar106._0_4_ = auVar104._0_4_ * -2.0;
                    auVar106._4_4_ = auVar104._4_4_ * -2.0;
                    auVar106._8_4_ = auVar104._8_4_ * -2.0;
                    auVar106._12_4_ = auVar104._12_4_ * -2.0;
                    auVar52._8_4_ = 0x7fffffff;
                    auVar52._0_8_ = 0x7fffffff7fffffff;
                    auVar52._12_4_ = 0x7fffffff;
                    auVar104 = vblendvps_avx(auVar106,auVar52,auVar149);
                    auVar53._8_4_ = 0x42b0c0a5;
                    auVar53._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar53._12_4_ = 0x42b0c0a5;
                    auVar104 = vminps_avx(auVar104,auVar53);
                    auVar54._8_4_ = 0xc2b0c0a5;
                    auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar54._12_4_ = 0xc2b0c0a5;
                    auVar144 = vmaxps_avx(auVar104,auVar54);
                    auVar104 = vfmadd213ps_fma(auVar179,auVar144,auVar130);
                    auVar120._0_4_ = (int)auVar104._0_4_;
                    auVar120._4_4_ = (int)auVar104._4_4_;
                    auVar120._8_4_ = (int)auVar104._8_4_;
                    auVar120._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar120);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar104 = vandps_avx(auVar104,auVar46);
                    auVar104 = vsubps_avx(auVar149,auVar104);
                    auVar149 = vfmsub231ps_fma(auVar144,auVar104,auVar112);
                    auVar144 = vfnmsub231ps_fma(auVar149,auVar104,auVar113);
                    auVar121._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                    auVar121._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                    auVar121._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                    auVar121._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                    auVar134._8_4_ = 0x39506967;
                    auVar134._0_8_ = 0x3950696739506967;
                    auVar134._12_4_ = 0x39506967;
                    auVar175._8_4_ = 0x3ab743ce;
                    auVar175._0_8_ = 0x3ab743ce3ab743ce;
                    auVar175._12_4_ = 0x3ab743ce;
                    auVar149 = vfmadd213ps_fma(auVar134,auVar144,auVar175);
                    auVar138._8_4_ = 0x3c088908;
                    auVar138._0_8_ = 0x3c0889083c088908;
                    auVar138._12_4_ = 0x3c088908;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar138);
                    auVar55._8_4_ = 0x3d2aa9c1;
                    auVar55._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar55._12_4_ = 0x3d2aa9c1;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar55);
                    auVar165._8_4_ = 0x3e2aaaaa;
                    auVar165._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar165._12_4_ = 0x3e2aaaaa;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar165);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar130);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar121,auVar144);
                    auVar122._0_4_ = auVar149._0_4_ + 1.0;
                    auVar122._4_4_ = auVar149._4_4_ + 1.0;
                    auVar122._8_4_ = auVar149._8_4_ + 1.0;
                    auVar122._12_4_ = auVar149._12_4_ + 1.0;
                    auVar97._0_4_ = (int)auVar104._0_4_;
                    auVar97._4_4_ = (int)auVar104._4_4_;
                    auVar97._8_4_ = (int)auVar104._8_4_;
                    auVar97._12_4_ = (int)auVar104._12_4_;
                    auVar104 = vpslld_avx(auVar97,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar46);
                    auVar149 = vfmadd213ps_fma(auVar104,auVar122,auVar46);
                    auVar104 = vrcpps_avx(auVar149);
                    auVar123._0_4_ = auVar104._0_4_ + auVar104._0_4_;
                    auVar123._4_4_ = auVar104._4_4_ + auVar104._4_4_;
                    auVar123._8_4_ = auVar104._8_4_ + auVar104._8_4_;
                    auVar123._12_4_ = auVar104._12_4_ + auVar104._12_4_;
                    auVar56._8_4_ = 0x40000000;
                    auVar56._0_8_ = 0x4000000040000000;
                    auVar56._12_4_ = 0x40000000;
                    auVar149 = vfmsub213ps_fma(auVar149,auVar123,auVar56);
                    auVar95 = vfnmadd213ps_fma(auVar149,auVar104,auVar123);
                    auVar57._8_4_ = 0x42b0c0a5;
                    auVar57._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar57._12_4_ = 0x42b0c0a5;
                    auVar104 = vminps_avx(auVar82,auVar57);
                    auVar58._8_4_ = 0xc2b0c0a5;
                    auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar58._12_4_ = 0xc2b0c0a5;
                    auVar144 = vmaxps_avx(auVar104,auVar58);
                    auVar104 = vfmadd213ps_fma(auVar179,auVar144,auVar130);
                    auVar146._0_4_ = (int)auVar104._0_4_;
                    auVar146._4_4_ = (int)auVar104._4_4_;
                    auVar146._8_4_ = (int)auVar104._8_4_;
                    auVar146._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar146);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar104 = vandps_avx(auVar104,auVar46);
                    auVar104 = vsubps_avx(auVar149,auVar104);
                    auVar59._8_4_ = 0x3f318000;
                    auVar59._0_8_ = 0x3f3180003f318000;
                    auVar59._12_4_ = 0x3f318000;
                    auVar149 = vfmsub231ps_fma(auVar144,auVar104,auVar59);
                    auVar144 = vfnmsub231ps_fma(auVar149,auVar104,auVar113);
                    auVar147._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                    auVar147._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                    auVar147._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                    auVar147._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                    auVar149 = vfmadd213ps_fma(auVar134,auVar144,auVar175);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar138);
                    auVar139._8_4_ = 0x3d2aa9c1;
                    auVar139._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar139._12_4_ = 0x3d2aa9c1;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar139);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar165);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar130);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar147,auVar144);
                    auVar148._0_4_ = auVar149._0_4_ + 1.0;
                    auVar148._4_4_ = auVar149._4_4_ + 1.0;
                    auVar148._8_4_ = auVar149._8_4_ + 1.0;
                    auVar148._12_4_ = auVar149._12_4_ + 1.0;
                    auVar107._0_4_ = (int)auVar104._0_4_;
                    auVar107._4_4_ = (int)auVar104._4_4_;
                    auVar107._8_4_ = (int)auVar104._8_4_;
                    auVar107._12_4_ = (int)auVar104._12_4_;
                    auVar104 = vpslld_avx(auVar107,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar46);
                    auVar80 = vfmadd213ps_fma(auVar104,auVar148,auVar46);
                    auVar60._8_4_ = 0x800000;
                    auVar60._0_8_ = 0x80000000800000;
                    auVar60._12_4_ = 0x800000;
                    auVar104 = vmaxps_avx(auVar80,auVar60);
                    auVar149 = vpsrld_avx(auVar104,0x17);
                    auVar61._8_4_ = 0x807fffff;
                    auVar61._0_8_ = 0x807fffff807fffff;
                    auVar61._12_4_ = 0x807fffff;
                    auVar104 = vandps_avx(auVar104,auVar61);
                    auVar79 = vorps_avx(auVar130,auVar104);
                    auVar62._8_4_ = 0xffffff82;
                    auVar62._0_8_ = 0xffffff82ffffff82;
                    auVar62._12_4_ = 0xffffff82;
                    auVar104 = vpaddd_avx(auVar149,auVar62);
                    auVar144 = vcvtdq2ps_avx(auVar104);
                    auVar63._8_4_ = 0x3f3504f3;
                    auVar63._0_8_ = 0x3f3504f33f3504f3;
                    auVar63._12_4_ = 0x3f3504f3;
                    auVar149 = vcmpps_avx(auVar79,auVar63,1);
                    auVar104 = vandps_avx(auVar149,auVar79);
                    auVar124._0_4_ = auVar104._0_4_ + auVar79._0_4_ + -1.0;
                    auVar124._4_4_ = auVar104._4_4_ + auVar79._4_4_ + -1.0;
                    auVar124._8_4_ = auVar104._8_4_ + auVar79._8_4_ + -1.0;
                    auVar124._12_4_ = auVar104._12_4_ + auVar79._12_4_ + -1.0;
                    auVar104 = vandps_avx(auVar149,auVar46);
                    auVar149 = vsubps_avx(auVar144,auVar104);
                    auVar172._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                    auVar172._4_4_ = auVar124._4_4_ * auVar124._4_4_;
                    auVar172._8_4_ = auVar124._8_4_ * auVar124._8_4_;
                    auVar172._12_4_ = auVar124._12_4_ * auVar124._12_4_;
                    auVar176._8_4_ = 0x3d9021bb;
                    auVar176._0_8_ = 0x3d9021bb3d9021bb;
                    auVar176._12_4_ = 0x3d9021bb;
                    auVar64._8_4_ = 0xbdebd1b8;
                    auVar64._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar64._12_4_ = 0xbdebd1b8;
                    auVar104 = vfmadd213ps_fma(auVar176,auVar124,auVar64);
                    auVar65._8_4_ = 0x3def251a;
                    auVar65._0_8_ = 0x3def251a3def251a;
                    auVar65._12_4_ = 0x3def251a;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar65);
                    auVar66._8_4_ = 0xbdfe5d4f;
                    auVar66._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar66._12_4_ = 0xbdfe5d4f;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar66);
                    auVar67._8_4_ = 0x3e11e9bf;
                    auVar67._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar67._12_4_ = 0x3e11e9bf;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar67);
                    auVar68._8_4_ = 0xbe2aae50;
                    auVar68._0_8_ = 0xbe2aae50be2aae50;
                    auVar68._12_4_ = 0xbe2aae50;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar68);
                    auVar69._8_4_ = 0x3e4cceac;
                    auVar69._0_8_ = 0x3e4cceac3e4cceac;
                    auVar69._12_4_ = 0x3e4cceac;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar69);
                    auVar70._8_4_ = 0xbe7ffffc;
                    auVar70._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar70._12_4_ = 0xbe7ffffc;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar70);
                    auVar71._8_4_ = 0x3eaaaaaa;
                    auVar71._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar71._12_4_ = 0x3eaaaaaa;
                    auVar104 = vfmadd213ps_fma(auVar104,auVar124,auVar71);
                    auVar177._0_4_ = auVar172._0_4_ * auVar124._0_4_ * auVar104._0_4_;
                    auVar177._4_4_ = auVar172._4_4_ * auVar124._4_4_ * auVar104._4_4_;
                    auVar177._8_4_ = auVar172._8_4_ * auVar124._8_4_ * auVar104._8_4_;
                    auVar177._12_4_ = auVar172._12_4_ * auVar124._12_4_ * auVar104._12_4_;
                    auVar135._8_4_ = 0xb95e8083;
                    auVar135._0_8_ = 0xb95e8083b95e8083;
                    auVar135._12_4_ = 0xb95e8083;
                    auVar104 = vfmadd231ps_fma(auVar177,auVar149,auVar135);
                    auVar144 = vfmsub231ps_fma(auVar104,auVar130,auVar172);
                    auVar104 = vcmpps_avx(auVar80,(undefined1  [16])0x0,2);
                    auVar144 = vsubps_avx(auVar144,auVar124);
                    auVar166._8_4_ = 0x3f318000;
                    auVar166._0_8_ = 0x3f3180003f318000;
                    auVar166._12_4_ = 0x3f318000;
                    auVar149 = vfmsub231ps_fma(auVar144,auVar166,auVar149);
                    auVar125._0_4_ = auVar149._0_4_ * -2.0;
                    auVar125._4_4_ = auVar149._4_4_ * -2.0;
                    auVar125._8_4_ = auVar149._8_4_ * -2.0;
                    auVar125._12_4_ = auVar149._12_4_ * -2.0;
                    auVar72._8_4_ = 0x7fffffff;
                    auVar72._0_8_ = 0x7fffffff7fffffff;
                    auVar72._12_4_ = 0x7fffffff;
                    auVar104 = vblendvps_avx(auVar125,auVar72,auVar104);
                    auVar73._8_4_ = 0x42b0c0a5;
                    auVar73._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar73._12_4_ = 0x42b0c0a5;
                    auVar104 = vminps_avx(auVar104,auVar73);
                    auVar74._8_4_ = 0xc2b0c0a5;
                    auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar74._12_4_ = 0xc2b0c0a5;
                    auVar144 = vmaxps_avx(auVar104,auVar74);
                    auVar104 = vfmadd213ps_fma(auVar179,auVar144,auVar130);
                    auVar150._0_4_ = (int)auVar104._0_4_;
                    auVar150._4_4_ = (int)auVar104._4_4_;
                    auVar150._8_4_ = (int)auVar104._8_4_;
                    auVar150._12_4_ = (int)auVar104._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar150);
                    auVar104 = vcmpps_avx(auVar104,auVar149,1);
                    auVar104 = vandps_avx(auVar104,auVar46);
                    auVar104 = vsubps_avx(auVar149,auVar104);
                    auVar149 = vfmsub231ps_fma(auVar144,auVar104,auVar166);
                    auVar144 = vfnmsub231ps_fma(auVar149,auVar104,auVar135);
                    auVar151._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                    auVar151._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                    auVar151._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                    auVar151._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                    auVar173._8_4_ = 0x39506967;
                    auVar173._0_8_ = 0x3950696739506967;
                    auVar173._12_4_ = 0x39506967;
                    auVar75._8_4_ = 0x3ab743ce;
                    auVar75._0_8_ = 0x3ab743ce3ab743ce;
                    auVar75._12_4_ = 0x3ab743ce;
                    auVar149 = vfmadd213ps_fma(auVar173,auVar144,auVar75);
                    auVar76._8_4_ = 0x3c088908;
                    auVar76._0_8_ = 0x3c0889083c088908;
                    auVar76._12_4_ = 0x3c088908;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar76);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar139);
                    auVar77._8_4_ = 0x3e2aaaaa;
                    auVar77._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar77._12_4_ = 0x3e2aaaaa;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar77);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar144,auVar130);
                    auVar149 = vfmadd213ps_fma(auVar149,auVar151,auVar144);
                    auVar108._0_4_ = auVar149._0_4_ + 1.0;
                    auVar108._4_4_ = auVar149._4_4_ + 1.0;
                    auVar108._8_4_ = auVar149._8_4_ + 1.0;
                    auVar108._12_4_ = auVar149._12_4_ + 1.0;
                    auVar126._0_4_ = (int)auVar104._0_4_;
                    auVar126._4_4_ = (int)auVar104._4_4_;
                    auVar126._8_4_ = (int)auVar104._8_4_;
                    auVar126._12_4_ = (int)auVar104._12_4_;
                    auVar104 = vpslld_avx(auVar126,0x17);
                    auVar104 = vpaddd_avx(auVar104,auVar46);
                    auVar149 = vfmadd213ps_fma(auVar104,auVar108,auVar46);
                    auVar104 = vrcpps_avx(auVar149);
                    auVar152._0_4_ = auVar104._0_4_ + auVar104._0_4_;
                    auVar152._4_4_ = auVar104._4_4_ + auVar104._4_4_;
                    auVar152._8_4_ = auVar104._8_4_ + auVar104._8_4_;
                    auVar152._12_4_ = auVar104._12_4_ + auVar104._12_4_;
                    auVar47._8_4_ = 0x40000000;
                    auVar47._0_8_ = 0x4000000040000000;
                    auVar47._12_4_ = 0x40000000;
                    auVar149 = vfmsub213ps_fma(auVar149,auVar152,auVar47);
                    auVar104 = vfnmadd213ps_fma(auVar149,auVar104,auVar152);
                    auVar89 = vfmsub231ps_fma(auVar89,auVar89,auVar95);
                    auVar82 = vfmsub231ps_fma(auVar82,auVar82,auVar104);
                    break;
                  case 6:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var24);
                    auVar101._4_4_ = uVar5;
                    auVar101._0_4_ = uVar5;
                    auVar101._8_4_ = uVar5;
                    auVar101._12_4_ = uVar5;
                    uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var24))[1];
                    auVar111._4_4_ = uVar5;
                    auVar111._0_4_ = uVar5;
                    auVar111._8_4_ = uVar5;
                    auVar111._12_4_ = uVar5;
                    auVar104 = vfmadd213ps_fma(auVar89,auVar101,auVar111);
                    auVar104 = vmaxps_avx(auVar104,(undefined1  [16])0x0);
                    auVar49._8_4_ = 0x3f800000;
                    auVar49._0_8_ = 0x3f8000003f800000;
                    auVar49._12_4_ = 0x3f800000;
                    auVar104 = vminps_avx(auVar104,auVar49);
                    auVar89._0_4_ = auVar104._0_4_ * auVar89._0_4_;
                    auVar89._4_4_ = auVar104._4_4_ * fVar31;
                    auVar89._8_4_ = auVar104._8_4_ * fVar3;
                    auVar89._12_4_ = auVar104._12_4_ * fVar11;
                    auVar104 = vfmadd213ps_fma(auVar101,auVar82,auVar111);
                    auVar104 = vmaxps_avx(auVar104,(undefined1  [16])0x0);
                    auVar104 = vminps_avx(auVar104,auVar49);
                    auVar82._0_4_ = auVar104._0_4_ * auVar82._0_4_;
                    auVar82._4_4_ = auVar104._4_4_ * fVar44;
                    auVar82._8_4_ = auVar104._8_4_ * fVar2;
                    auVar82._12_4_ = auVar104._12_4_ * fVar81;
                  }
                  if (iVar4 < 0x65) {
                    *pauVar38 = auVar89;
                    pauVar38[1] = auVar82;
                    pauVar38 = pauVar38 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var24) +
                                      local_2f8 * 0x20);
                    auVar92._0_4_ = auVar89._0_4_ * *pfVar1;
                    auVar92._4_4_ = auVar89._4_4_ * pfVar1[1];
                    auVar92._8_4_ = auVar89._8_4_ * pfVar1[2];
                    auVar92._12_4_ = auVar89._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var24) + 0x10 +
                                      local_2f8 * 0x20);
                    auVar86._0_4_ = auVar82._0_4_ * *pfVar1;
                    auVar86._4_4_ = auVar82._4_4_ * pfVar1[1];
                    auVar86._8_4_ = auVar82._8_4_ * pfVar1[2];
                    auVar86._12_4_ = auVar82._12_4_ * pfVar1[3];
                    auVar50._8_4_ = 0x80000000;
                    auVar50._0_8_ = 0x8000000080000000;
                    auVar50._12_4_ = 0x80000000;
                    auVar104 = vandps_avx(auVar92,auVar50);
                    auVar149 = vandps_avx(auVar86,auVar50);
                    auVar51._8_4_ = 0x3f000000;
                    auVar51._0_8_ = 0x3f0000003f000000;
                    auVar51._12_4_ = 0x3f000000;
                    auVar104 = vorps_avx(auVar104,auVar51);
                    auVar149 = vorps_avx(auVar149,auVar51);
                    auVar93._0_4_ = (int)(auVar92._0_4_ + auVar104._0_4_);
                    auVar93._4_4_ = (int)(auVar92._4_4_ + auVar104._4_4_);
                    auVar93._8_4_ = (int)(auVar92._8_4_ + auVar104._8_4_);
                    auVar93._12_4_ = (int)(auVar92._12_4_ + auVar104._12_4_);
                    auVar87._0_4_ = (int)(auVar86._0_4_ + auVar149._0_4_);
                    auVar87._4_4_ = (int)(auVar86._4_4_ + auVar149._4_4_);
                    auVar87._8_4_ = (int)(auVar86._8_4_ + auVar149._8_4_);
                    auVar87._12_4_ = (int)(auVar86._12_4_ + auVar149._12_4_);
                    auVar104 = vpackssdw_avx(auVar93,auVar87);
                    auVar104 = vpminsw_avx(auVar104,_DAT_0055f790);
                    auVar104 = vpmaxsw_avx(auVar104,_DAT_0055f7a0);
                    auVar104 = vpacksswb_avx(auVar104,auVar104);
                    *(long *)*pauVar35 = auVar104._0_8_;
                    pauVar35 = (undefined1 (*) [16])((long)*pauVar35 + 8);
                  }
                  bVar43 = iVar30 != iVar28;
                  iVar30 = iVar30 + 1;
                } while (bVar43);
              }
              pp_Var20 = (_func_int **)(ulong)(iVar36 + 1);
            } while (iVar36 != (int)local_230);
          }
          local_2f8 = local_2f8 + 1;
          local_298 = (ulong)(uint)((int)local_298 + (int)uVar42 * 8);
        } while (local_2f8 != local_280);
      }
      local_288 = top_blob;
      if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
        uVar42 = local_2e8._16_8_ - local_2e8._0_8_;
        pfVar33 = (pointer)local_2e8._0_8_;
LAB_003e3ca0:
        operator_delete(pfVar33,uVar42);
      }
    }
    iVar26 = 0;
    goto LAB_003e3d8d;
  }
  uVar22 = *(uint *)(&this->field_0xd0 + (long)p_Var24);
  iVar28 = *(int *)(&this->field_0x10c + (long)p_Var24);
  local_298 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar28 < 0x65) {
      local_298 = (ulong)((uint)((uVar22 & 3) == 0) * 3 + 1);
    }
    else {
      local_298 = 1;
      if ((uVar22 & 7) == 0) {
        local_298 = 8;
      }
    }
  }
  iVar4 = (int)local_298;
  uVar42 = (ulong)(uint)(iVar4 * 4);
  if (100 < iVar28) {
    uVar42 = local_298;
  }
  local_290 = (_func_int **)CONCAT44(local_290._4_4_,iVar30);
  Mat::create(top_blob,iVar30,iVar36,(int)uVar22 / iVar4,uVar42,iVar4,opt->blob_allocator);
  auVar17 = stack0xfffffffffffffd38;
  iVar26 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003e3d8d;
  uVar29 = (int)uVar29 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  uVar22 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  iVar30 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar30 = 1;
    if ((uVar29 & 7) == 0) {
      iVar30 = 8;
    }
    if (iVar28 < 0x65) {
      _elempack = (uint)((uVar22 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar22 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_2e8._12_4_ = local_228.refcount._4_4_;
  local_2e8._8_4_ = local_228.refcount._0_4_;
  local_2e8._0_8_ = local_228.data;
  local_2e8._16_8_ = local_228.elemsize;
  local_2e8._24_4_ = local_228.elempack;
  uStack_2c0._4_4_ = local_228.w;
  uStack_2c0._0_4_ = local_228.dims;
  uStack_2b8._4_4_ = local_228.d;
  uStack_2b8._0_4_ = local_228.h;
  local_2e8._32_8_ = local_228.allocator;
  uStack_2ac = auVar17._28_4_;
  iStack_2b0 = local_228.c;
  local_2a8 = local_228.cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  if (iVar30 < iVar6) {
    local_278.data = *(void **)opt;
    local_278.elemsize = (size_t)opt->workspace_allocator;
    local_278.elempack = opt->openmp_blocktime;
    local_278._28_1_ = opt->use_winograd_convolution;
    local_278._29_1_ = opt->use_sgemm_convolution;
    local_278._30_1_ = opt->use_int8_inference;
    local_278._31_1_ = opt->use_vulkan_compute;
    local_278.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_278._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_278._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_278._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_278.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_228,(Mat *)local_2e8,iVar30,(Option *)&local_278);
  }
  piVar7 = top_blob->refcount;
  local_278.data = top_blob->data;
  local_278.refcount = top_blob->refcount;
  local_278.elemsize = top_blob->elemsize;
  local_278.elempack = top_blob->elempack;
  local_278.allocator = top_blob->allocator;
  local_278.dims = top_blob->dims;
  local_278.w = top_blob->w;
  local_278.h = top_blob->h;
  local_278.d = top_blob->d;
  local_278.c = top_blob->c;
  local_278.cstep = top_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
  if (_elempack < (uint)local_298) {
    Mat::create(&local_278,(int)local_290,iVar36,
                *(int *)(&this->field_0xd0 + (long)pp_Var23[-3]) / (int)_elempack,
                (ulong)((byte)((ushort)uVar42 / (ushort)(byte)local_298) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar26 = -100;
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86_fma;
      goto LAB_003e3122;
    }
  }
  else {
LAB_003e3122:
    local_288 = top_blob;
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
      local_290 = (_func_int **)CONCAT44(local_290._4_4_,(int)uVar29 / iVar30);
      iVar28 = 0;
      iVar36 = 0;
      lVar27 = 0;
      do {
        auVar17 = stack0xfffffffffffffd38;
        local_1c8 = (pointer)((long)(iVar28 / iVar30) * local_2a8 * local_2e8._16_8_ +
                             local_2e8._0_8_);
        local_1c0 = (int *)0x0;
        local_1b8 = (Allocator *)local_2e8._16_8_;
        local_1b0 = local_2e8._24_4_;
        local_1a8 = (Allocator *)local_2e8._32_8_;
        local_190 = (int)local_290;
        uVar16 = uStack_2c0;
        uVar18 = uStack_2b8;
        local_188 = ((long)uStack_2b8._4_4_ * local_2e8._16_8_ *
                     (long)(int)uStack_2b8 * (long)uStack_2c0._4_4_ + 0xfU & 0xfffffffffffffff0) /
                    (ulong)local_2e8._16_8_;
        uStack_2c0._0_4_ = (int)uVar16;
        uStack_2c0._4_4_ = SUB84(uVar16,4);
        local_1a0 = (int)uStack_2c0;
        iStack_19c = uStack_2c0._4_4_;
        uStack_2b8._0_4_ = (int)uVar18;
        uStack_2b8._4_4_ = SUB84(uVar18,4);
        iStack_198 = (int)uStack_2b8;
        iStack_194 = uStack_2b8._4_4_;
        local_120 = (void *)((long)(iVar36 / (int)_elempack) * local_278.cstep * local_278.elemsize
                            + (long)local_278.data);
        local_118 = (int *)0x0;
        local_110 = local_278.elemsize;
        local_108 = local_278.elempack;
        local_100 = local_278.allocator;
        local_e0 = ((long)local_278.d * local_278.elemsize * (long)local_278.h * (long)local_278.w +
                    0xf & 0xfffffffffffffff0) / local_278.elemsize;
        local_f8 = local_278.dims;
        iStack_f4 = local_278.w;
        iStack_f0 = local_278.h;
        iStack_ec = local_278.d;
        pLVar10 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar27];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_278.allocator;
        unique0x100050e4 = auVar17;
        local_e8 = (int)uVar22 / (int)_elempack;
        (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1c8,&local_120);
        if (local_118 != (int *)0x0) {
          LOCK();
          *local_118 = *local_118 + -1;
          UNLOCK();
          if (*local_118 == 0) {
            if (local_100 == (Allocator *)0x0) {
              if (local_120 != (void *)0x0) {
                free(local_120);
              }
            }
            else {
              (*local_100->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1c0 != (int *)0x0) {
          LOCK();
          *local_1c0 = *local_1c0 + -1;
          UNLOCK();
          if (*local_1c0 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              if (local_1c8 != (pointer)0x0) {
                free(local_1c8);
              }
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
        lVar27 = lVar27 + 1;
        iVar36 = iVar36 + uVar22;
        iVar28 = iVar28 + uVar29;
      } while (lVar27 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
    }
    pMVar15 = local_288;
    if (_elempack < (uint)local_298) {
      convert_packing(&local_278,local_288,(uint)local_298,opt);
      iVar26 = 0;
    }
    else {
      iVar26 = 0;
      if (&local_278 != local_288) {
        if (local_278.refcount != (int *)0x0) {
          LOCK();
          *local_278.refcount = *local_278.refcount + 1;
          UNLOCK();
        }
        piVar7 = local_288->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_288->allocator == (Allocator *)0x0) {
              if (local_288->data != (void *)0x0) {
                free(local_288->data);
              }
            }
            else {
              (*local_288->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar26 = 0;
        pMVar15->data = local_278.data;
        pMVar15->refcount = local_278.refcount;
        pMVar15->elemsize = local_278.elemsize;
        pMVar15->elempack = local_278.elempack;
        pMVar15->allocator = local_278.allocator;
        pMVar15->dims = local_278.dims;
        pMVar15->w = local_278.w;
        pMVar15->h = local_278.h;
        pMVar15->d = local_278.d;
        pMVar15->c = local_278.c;
        pMVar15->cstep = local_278.cstep;
      }
    }
  }
  if (local_278.refcount != (int *)0x0) {
    LOCK();
    *local_278.refcount = *local_278.refcount + -1;
    UNLOCK();
    if (*local_278.refcount == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2e8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2e8._8_8_ = *(int *)(_func_int ***)local_2e8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2e8._8_8_ == 0) {
      if ((Allocator *)local_2e8._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          free((void *)local_2e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2e8._32_8_)[3])();
      }
    }
  }
LAB_003e3d8d:
  piVar7 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}